

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::CheckerInstantiationSyntax::CheckerInstantiationSyntax
          (CheckerInstantiationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,NameSyntax *type,
          ParameterValueAssignmentSyntax *parameters,
          SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances,Token semi)

{
  Token TVar1;
  bool bVar2;
  NameSyntax *pNVar3;
  HierarchicalInstanceSyntax *pHVar4;
  HierarchicalInstanceSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *local_30;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances_local;
  ParameterValueAssignmentSyntax *parameters_local;
  NameSyntax *type_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  CheckerInstantiationSyntax *this_local;
  
  TVar1 = semi;
  local_30 = instances;
  instances_local = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)parameters;
  parameters_local = (ParameterValueAssignmentSyntax *)type;
  type_local = (NameSyntax *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,CheckerInstantiation,attributes);
  __range2 = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)parameters_local;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->type,(NameSyntax **)&__range2);
  this->parameters = (ParameterValueAssignmentSyntax *)instances_local;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (&this->instances,local_30);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  pNVar3 = not_null<slang::syntax::NameSyntax_*>::operator->(&this->type);
  (pNVar3->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->parameters != (ParameterValueAssignmentSyntax *)0x0) {
    (this->parameters->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  (this->instances).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin(&this->instances);
  _child = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end(&this->instances);
  while( true ) {
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)&child);
    if (!bVar2) break;
    pHVar4 = SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
             iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>::operator*
                       ((iterator_base<slang::syntax::HierarchicalInstanceSyntax_*> *)&__end2.index)
    ;
    (pHVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<slang::syntax::HierarchicalInstanceSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::HierarchicalInstanceSyntax_*,_unsigned_long,_slang::syntax::HierarchicalInstanceSyntax_**,_slang::syntax::HierarchicalInstanceSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

CheckerInstantiationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, NameSyntax& type, ParameterValueAssignmentSyntax* parameters, const SeparatedSyntaxList<HierarchicalInstanceSyntax>& instances, Token semi) :
        MemberSyntax(SyntaxKind::CheckerInstantiation, attributes), type(&type), parameters(parameters), instances(instances), semi(semi) {
        this->type->parent = this;
        if (this->parameters) this->parameters->parent = this;
        this->instances.parent = this;
        for (auto child : this->instances)
            child->parent = this;
    }